

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoop::EventLoop(EventLoop *this)

{
  uint *puVar1;
  char *pcVar2;
  sz_event fd;
  Poller *pPVar3;
  TimerQueue *this_00;
  Channel *pCVar4;
  LogStream *pLVar5;
  char **ppcVar6;
  int *in_FS_OFFSET;
  SourceFile file;
  SourceFile file_00;
  Logger local_1028;
  _Any_data local_58;
  code *pcStack_48;
  code *pcStack_40;
  unique_ptr<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_> *local_38;
  
  this->_vptr_EventLoop = (_func_int **)&PTR__EventLoop_0011db30;
  this->m_iteration = 0;
  this->m_looping = false;
  this->m_quit = (__atomic_base<bool>)0x0;
  this->m_eventHandling = false;
  this->m_callingPendingFunctors = false;
  sznet::CurrentThread::t_cachedTid::__tls_init();
  if (*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  sznet::CurrentThread::t_cachedTid::__tls_init();
  this->m_threadId = *in_FS_OFFSET;
  Timestamp::Timestamp(&this->m_pollTime);
  pPVar3 = Poller::newDefaultPoller(this);
  (this->m_poller)._M_t.
  super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>.
  super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl = pPVar3;
  this_00 = (TimerQueue *)operator_new(0x50);
  TimerQueue::TimerQueue(this_00,this);
  local_38 = &this->m_timerQueue;
  (local_38->_M_t).super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>
  ._M_t.super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>.
  super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl = this_00;
  fd = sockets::sz_create_eventfd();
  this->m_wakeupFd = fd;
  pCVar4 = (Channel *)operator_new(0xb8);
  Channel::Channel(pCVar4,this,fd);
  (this->m_wakeupChannel)._M_t.
  super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
  super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl = pCVar4;
  (this->m_mutex).m_holder = 0;
  (this->m_activeChannels).
  super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_activeChannels).
  super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_activeChannels).
  super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_currentActiveChannel = (Channel *)0x0;
  sz_mutex_init(&(this->m_mutex).m_mutex);
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (g_logLevel < 2) {
    file._8_8_ = 0xd;
    file.m_data = "EventLoop.cpp";
    Logger::Logger(&local_1028,file,0x38,DEBUG,"EventLoop");
    if (0x12 < (uint)(((int)&local_1028 + 0xfb0) - (int)local_1028.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1028.m_impl.m_stream.m_buffer.m_cur,"EventLoop created ",0x12);
      local_1028.m_impl.m_stream.m_buffer.m_cur = local_1028.m_impl.m_stream.m_buffer.m_cur + 0x12;
    }
    pLVar5 = LogStream::operator<<(&local_1028.m_impl.m_stream,this);
    ppcVar6 = &(pLVar5->m_buffer).m_cur;
    pcVar2 = (pLVar5->m_buffer).m_cur;
    if (0xb < (uint)((int)ppcVar6 - (int)pcVar2)) {
      builtin_strncpy(pcVar2," in thread ",0xb);
      *ppcVar6 = *ppcVar6 + 0xb;
    }
    LogStream::operator<<(pLVar5,this->m_threadId);
    Logger::~Logger(&local_1028);
  }
  if (*(long *)(in_FS_OFFSET + -0x8e) == 0) {
    *(EventLoop **)(in_FS_OFFSET + -0x8e) = this;
  }
  else {
    file_00._8_8_ = 0xd;
    file_00.m_data = "EventLoop.cpp";
    Logger::Logger(&local_1028,file_00,0x3b,FATAL);
    if (0x12 < (uint)(((int)&local_1028 + 0xfb0) - (int)local_1028.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1028.m_impl.m_stream.m_buffer.m_cur,"Another EventLoop ",0x12);
      local_1028.m_impl.m_stream.m_buffer.m_cur = local_1028.m_impl.m_stream.m_buffer.m_cur + 0x12;
    }
    pLVar5 = LogStream::operator<<(&local_1028.m_impl.m_stream,*(void **)(in_FS_OFFSET + -0x8e));
    ppcVar6 = &(pLVar5->m_buffer).m_cur;
    pcVar2 = (pLVar5->m_buffer).m_cur;
    if (0x17 < (uint)((int)ppcVar6 - (int)pcVar2)) {
      builtin_strncpy(pcVar2," exists in this thread ",0x17);
      *ppcVar6 = *ppcVar6 + 0x17;
    }
    LogStream::operator<<(pLVar5,this->m_threadId);
    Logger::~Logger(&local_1028);
  }
  pCVar4 = (this->m_wakeupChannel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  pcStack_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = handleRead;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(EventLoop **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(sznet::Timestamp),_std::_Bind<void_(sznet::net::EventLoop::*(sznet::net::EventLoop_*))()>_>
               ::_M_invoke;
  pcStack_48 = std::
               _Function_handler<void_(sznet::Timestamp),_std::_Bind<void_(sznet::net::EventLoop::*(sznet::net::EventLoop_*))()>_>
               ::_M_manager;
  std::function<void_(sznet::Timestamp)>::operator=
            (&pCVar4->m_readCallback,(function<void_(sznet::Timestamp)> *)&local_58);
  if (pcStack_48 != (code *)0x0) {
    (*pcStack_48)(&local_58,&local_58,__destroy_functor);
  }
  pCVar4 = (this->m_wakeupChannel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  puVar1 = &pCVar4->m_events;
  *puVar1 = *puVar1 | 1;
  Channel::update(pCVar4);
  return;
}

Assistant:

EventLoop::EventLoop():
	m_looping(false),
	m_quit(false),
	m_eventHandling(false),
	m_callingPendingFunctors(false),
	m_iteration(0),
	m_threadId(CurrentThread::tid()),
	m_poller(Poller::newDefaultPoller(this)),
	m_timerQueue(new TimerQueue(this)),
	m_wakeupFd(sockets::sz_create_eventfd()),
#if defined(SZ_OS_WINDOWS)
	m_wakeupChannel(new Channel(this, m_wakeupFd.event_read)),
#else
	m_wakeupChannel(new Channel(this, m_wakeupFd)),
#endif
	m_currentActiveChannel(nullptr)
{
	LOG_DEBUG << "EventLoop created " << this << " in thread " << m_threadId;
	if (t_loopInThisThread)
	{
		LOG_FATAL << "Another EventLoop " << t_loopInThisThread
			<< " exists in this thread " << m_threadId;
	}
	else
	{
		t_loopInThisThread = this;
	}
	m_wakeupChannel->setReadCallback(std::bind(&EventLoop::handleRead, this));
	m_wakeupChannel->enableReading();
}